

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O0

VkBool32 vkb::default_debug_callback
                   (VkDebugUtilsMessageSeverityFlagBitsEXT messageSeverity,
                   VkDebugUtilsMessageTypeFlagsEXT messageType,
                   VkDebugUtilsMessengerCallbackDataEXT *pCallbackData,void *param_4)

{
  char *pcVar1;
  char *pcVar2;
  char *mt;
  char *ms;
  void *param_3_local;
  VkDebugUtilsMessengerCallbackDataEXT *pCallbackData_local;
  VkDebugUtilsMessageTypeFlagsEXT messageType_local;
  VkDebugUtilsMessageSeverityFlagBitsEXT messageSeverity_local;
  
  pcVar1 = to_string_message_severity(messageSeverity);
  pcVar2 = to_string_message_type(messageType);
  if ((messageType & 2) == 0) {
    printf("[%s: %s]\n%s\n",pcVar1,pcVar2,pCallbackData->pMessage);
  }
  else {
    printf("[%s: %s] - %s\n%s\n",pcVar1,pcVar2,pCallbackData->pMessageIdName,pCallbackData->pMessage
          );
  }
  return 0;
}

Assistant:

inline VKAPI_ATTR VkBool32 VKAPI_CALL default_debug_callback(VkDebugUtilsMessageSeverityFlagBitsEXT messageSeverity,
    VkDebugUtilsMessageTypeFlagsEXT messageType,
    const VkDebugUtilsMessengerCallbackDataEXT* pCallbackData,
    void*) {
    auto ms = to_string_message_severity(messageSeverity);
    auto mt = to_string_message_type(messageType);
    if (messageType & VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT) {
        printf("[%s: %s] - %s\n%s\n", ms, mt, pCallbackData->pMessageIdName, pCallbackData->pMessage);
    } else {
        printf("[%s: %s]\n%s\n", ms, mt, pCallbackData->pMessage);
    }

    return VK_FALSE; // Applications must return false here (Except Validation, if return true, will skip calling to driver)
}